

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O1

void __thiscall
TEST_DoublingFactorCounterTest_HonorTiles_Wind_Test::testBody
          (TEST_DoublingFactorCounterTest_HonorTiles_Wind_Test *this)

{
  WiningState *this_00;
  PlayerHand *this_01;
  _Rb_tree_header *p_Var1;
  set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_> *this_02;
  _Base_ptr p_Var2;
  pointer pTVar3;
  pointer pTVar4;
  UtestShell *pUVar5;
  _Rb_tree_header *p_Var6;
  char *pcVar7;
  char *pcVar8;
  _Base_ptr p_Var9;
  _Rb_tree_header *p_Var10;
  _Base_ptr p_Var11;
  DoubligFactorCounter *this_03;
  TestTerminatorWithoutExceptions local_160;
  vector<mahjong::Meld,_std::allocator<mahjong::Meld>_> local_158;
  DoublingFactorReport local_140;
  DoublingFactorReport r;
  
  this_00 = &(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).s;
  mahjong::WiningState::setRoundWind(this_00,EastWind);
  mahjong::WiningState::setSeatWind(this_00,SouthWind);
  this_01 = &(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).h;
  mahjong::PlayerHand::add(this_01,WhiteDragon);
  mahjong::PlayerHand::add(this_01,WhiteDragon);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addSequence
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,OneOfCharacters,true);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addSequence
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,TwoOfCircles,false);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addSequence
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,TwoOfBamboos,false);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addTriplet
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,EastWind,false);
  mahjong::WiningState::selfDrawn(this_00,(SelfDrawnSituation)0x0);
  this_03 = &(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).c;
  mahjong::DoubligFactorCounter::report(&r,this_03);
  p_Var1 = &r.patterns._M_t._M_impl.super__Rb_tree_header;
  p_Var9 = &p_Var1->_M_header;
  for (p_Var11 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      (_Rb_tree_header *)p_Var11 != (_Rb_tree_header *)0x0;
      p_Var11 = (&p_Var11->_M_left)[(int)*(size_t *)(p_Var11 + 1) < 0xe]) {
    if (0xd < (int)*(size_t *)(p_Var11 + 1)) {
      p_Var9 = p_Var11;
    }
  }
  p_Var10 = p_Var1;
  if (((_Rb_tree_header *)p_Var9 != p_Var1) &&
     (p_Var10 = (_Rb_tree_header *)p_Var9, 0xe < (int)((_Rb_tree_header *)p_Var9)->_M_node_count)) {
    p_Var10 = p_Var1;
  }
  p_Var11 = &p_Var1->_M_header;
  p_Var9 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var10 == p_Var1) {
    for (; (_Rb_tree_header *)p_Var9 != (_Rb_tree_header *)0x0;
        p_Var9 = (&p_Var9->_M_left)[(int)*(size_t *)(p_Var9 + 1) < 0xe]) {
      if (0xd < (int)*(size_t *)(p_Var9 + 1)) {
        p_Var11 = p_Var9;
      }
    }
    p_Var9 = &p_Var1->_M_header;
    p_Var2 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var10 = p_Var1;
    if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
       (p_Var10 = (_Rb_tree_header *)p_Var11, 0xe < (int)((_Rb_tree_header *)p_Var11)->_M_node_count
       )) {
      p_Var10 = p_Var1;
    }
    for (; (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
        p_Var2 = (&p_Var2->_M_left)[(int)*(size_t *)(p_Var2 + 1) < 0xe]) {
      if (0xd < (int)*(size_t *)(p_Var2 + 1)) {
        p_Var9 = p_Var2;
      }
    }
    p_Var6 = p_Var1;
    if (((_Rb_tree_header *)p_Var9 != p_Var1) &&
       (p_Var6 = (_Rb_tree_header *)p_Var9, 0xe < (int)((_Rb_tree_header *)p_Var9)->_M_node_count))
    {
      p_Var6 = p_Var1;
    }
    if ((p_Var6 == p_Var1) == (p_Var10 != p_Var1)) {
      pUVar5 = UtestShell::getCurrent();
      (*pUVar5->_vptr_UtestShell[0x1b])
                (pUVar5,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                 ,0x1df);
    }
    pUVar5 = UtestShell::getCurrent();
    StringFrom((int)&local_140);
    pcVar7 = SimpleString::asCharString((SimpleString *)&local_140);
    for (p_Var11 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var11 != (_Base_ptr)0x0; p_Var11 = (&p_Var11->_M_left)[(int)p_Var11[1]._M_color < 0xe]) {
    }
    StringFrom((unsigned_long)&local_158);
    pcVar8 = SimpleString::asCharString((SimpleString *)&local_158);
    local_160.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e08b8;
    (*pUVar5->_vptr_UtestShell[0x16])
              (pUVar5,1,pcVar7,pcVar8,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x1df,&local_160);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_160);
    SimpleString::~SimpleString((SimpleString *)&local_158);
    SimpleString::~SimpleString((SimpleString *)&local_140);
  }
  else {
    pUVar5 = UtestShell::getCurrent();
    local_140.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_exitCurrentTest_001e08b8;
    (*pUVar5->_vptr_UtestShell[0xe])
              (pUVar5,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x1df,&local_140);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_140);
  }
  if (r.doubling_factor == 1) {
    pUVar5 = UtestShell::getCurrent();
    local_140.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_exitCurrentTest_001e08b8;
    (*pUVar5->_vptr_UtestShell[0xe])
              (pUVar5,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x1e0,&local_140);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_140);
  }
  else {
    pUVar5 = UtestShell::getCurrent();
    StringFrom((int)&local_140);
    pcVar7 = SimpleString::asCharString((SimpleString *)&local_140);
    StringFrom((int)&local_158);
    pcVar8 = SimpleString::asCharString((SimpleString *)&local_158);
    local_160.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e08b8;
    (*pUVar5->_vptr_UtestShell[0x16])
              (pUVar5,1,pcVar7,pcVar8,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x1e0,&local_160);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_160);
    SimpleString::~SimpleString((SimpleString *)&local_158);
    SimpleString::~SimpleString((SimpleString *)&local_140);
  }
  mahjong::WiningState::setSeatWind(this_00,EastWind);
  mahjong::DoubligFactorCounter::report(&local_140,this_03);
  local_158.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)r.wining_hand.pairs.
                super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  local_158.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)r.wining_hand.pairs.
                super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.
                super__Vector_impl_data._M_finish;
  local_158.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)r.wining_hand.pairs.
                super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.
                super__Vector_impl_data._M_start;
  this_02 = &r.patterns;
  r.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_140.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>
       ._M_impl.super__Vector_impl_data._M_start;
  r.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_140.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  r.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_140.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_140.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_140.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_140.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<mahjong::Pair,_std::allocator<mahjong::Pair>_>::~vector
            ((vector<mahjong::Pair,_std::allocator<mahjong::Pair>_> *)&local_158);
  local_158.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       r.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  local_158.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.
  super__Vector_impl_data._M_finish =
       r.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl
       .super__Vector_impl_data._M_finish;
  local_158.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.
  super__Vector_impl_data._M_start =
       r.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl
       .super__Vector_impl_data._M_start;
  r.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_140.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>
       ._M_impl.super__Vector_impl_data._M_start;
  r.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_140.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  r.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_140.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_140.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_140.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_140.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>::~vector(&local_158);
  pTVar4 = r.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  pTVar3 = r.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
           _M_impl.super__Vector_impl_data._M_start;
  r.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_140.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>
       ._M_impl.super__Vector_impl_data._M_start;
  r.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_140.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  r.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_140.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_140.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_140.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_140.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pTVar3 != (pointer)0x0) {
    operator_delete(pTVar3,(long)pTVar4 - (long)pTVar3);
  }
  r.wining_hand.last_tile = local_140.wining_hand.last_tile;
  std::
  _Rb_tree<mahjong::Pattern,_mahjong::Pattern,_std::_Identity<mahjong::Pattern>,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
  ::clear(&this_02->_M_t);
  if (local_140.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var10 = &local_140.patterns._M_t._M_impl.super__Rb_tree_header;
    r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_140.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
    r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_140.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         local_140.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_140.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_140.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &p_Var1->_M_header;
    r.patterns._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_140.patterns._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_140.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_140.patterns._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_140.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var10->_M_header;
    local_140.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var10->_M_header;
  }
  r.bonus_tile_count = local_140.bonus_tile_count;
  r.doubling_factor = local_140.doubling_factor;
  std::
  _Rb_tree<mahjong::Pattern,_mahjong::Pattern,_std::_Identity<mahjong::Pattern>,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
  ::~_Rb_tree(&local_140.patterns._M_t);
  if (local_140.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_140.wining_hand.tiles.
                    super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_140.wining_hand.tiles.
                          super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.wining_hand.tiles.
                          super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>::~vector(&local_140.wining_hand.melds);
  std::vector<mahjong::Pair,_std::allocator<mahjong::Pair>_>::~vector
            ((vector<mahjong::Pair,_std::allocator<mahjong::Pair>_> *)&local_140);
  p_Var9 = &p_Var1->_M_header;
  for (p_Var11 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      (_Rb_tree_header *)p_Var11 != (_Rb_tree_header *)0x0;
      p_Var11 = (&p_Var11->_M_left)[(int)*(size_t *)(p_Var11 + 1) < 0x12]) {
    if (0x11 < (int)*(size_t *)(p_Var11 + 1)) {
      p_Var9 = p_Var11;
    }
  }
  p_Var10 = p_Var1;
  if (((_Rb_tree_header *)p_Var9 != p_Var1) &&
     (p_Var10 = (_Rb_tree_header *)p_Var9, 0x12 < (int)((_Rb_tree_header *)p_Var9)->_M_node_count))
  {
    p_Var10 = p_Var1;
  }
  p_Var11 = &p_Var1->_M_header;
  p_Var9 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var10 == p_Var1) {
    for (; (_Rb_tree_header *)p_Var9 != (_Rb_tree_header *)0x0;
        p_Var9 = (&p_Var9->_M_left)[(int)*(size_t *)(p_Var9 + 1) < 0x12]) {
      if (0x11 < (int)*(size_t *)(p_Var9 + 1)) {
        p_Var11 = p_Var9;
      }
    }
    p_Var9 = &p_Var1->_M_header;
    p_Var2 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var10 = p_Var1;
    if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
       (p_Var10 = (_Rb_tree_header *)p_Var11,
       0x12 < (int)((_Rb_tree_header *)p_Var11)->_M_node_count)) {
      p_Var10 = p_Var1;
    }
    for (; (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
        p_Var2 = (&p_Var2->_M_left)[(int)*(size_t *)(p_Var2 + 1) < 0x12]) {
      if (0x11 < (int)*(size_t *)(p_Var2 + 1)) {
        p_Var9 = p_Var2;
      }
    }
    p_Var6 = p_Var1;
    if (((_Rb_tree_header *)p_Var9 != p_Var1) &&
       (p_Var6 = (_Rb_tree_header *)p_Var9, 0x12 < (int)((_Rb_tree_header *)p_Var9)->_M_node_count))
    {
      p_Var6 = p_Var1;
    }
    if ((p_Var6 == p_Var1) == (p_Var10 != p_Var1)) {
      pUVar5 = UtestShell::getCurrent();
      (*pUVar5->_vptr_UtestShell[0x1b])
                (pUVar5,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                 ,0x1e5);
    }
    pUVar5 = UtestShell::getCurrent();
    StringFrom((int)&local_140);
    pcVar7 = SimpleString::asCharString((SimpleString *)&local_140);
    for (p_Var11 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var11 != (_Base_ptr)0x0; p_Var11 = (&p_Var11->_M_left)[(int)p_Var11[1]._M_color < 0x12]) {
    }
    StringFrom((unsigned_long)&local_158);
    pcVar8 = SimpleString::asCharString((SimpleString *)&local_158);
    local_160.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e08b8;
    (*pUVar5->_vptr_UtestShell[0x16])
              (pUVar5,1,pcVar7,pcVar8,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x1e5,&local_160);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_160);
    SimpleString::~SimpleString((SimpleString *)&local_158);
    SimpleString::~SimpleString((SimpleString *)&local_140);
  }
  else {
    pUVar5 = UtestShell::getCurrent();
    local_140.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_exitCurrentTest_001e08b8;
    (*pUVar5->_vptr_UtestShell[0xe])
              (pUVar5,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x1e5,&local_140);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_140);
  }
  if (r.doubling_factor == 2) {
    pUVar5 = UtestShell::getCurrent();
    local_140.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_exitCurrentTest_001e08b8;
    (*pUVar5->_vptr_UtestShell[0xe])
              (pUVar5,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x1e6,&local_140);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_140);
  }
  else {
    pUVar5 = UtestShell::getCurrent();
    StringFrom((int)&local_140);
    pcVar7 = SimpleString::asCharString((SimpleString *)&local_140);
    StringFrom((int)&local_158);
    pcVar8 = SimpleString::asCharString((SimpleString *)&local_158);
    local_160.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e08b8;
    (*pUVar5->_vptr_UtestShell[0x16])
              (pUVar5,1,pcVar7,pcVar8,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x1e6,&local_160);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_160);
    SimpleString::~SimpleString((SimpleString *)&local_158);
    SimpleString::~SimpleString((SimpleString *)&local_140);
  }
  mahjong::WiningState::setRoundWind(this_00,SouthWind);
  mahjong::DoubligFactorCounter::report(&local_140,this_03);
  local_158.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)r.wining_hand.pairs.
                super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  local_158.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)r.wining_hand.pairs.
                super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.
                super__Vector_impl_data._M_finish;
  local_158.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)r.wining_hand.pairs.
                super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.
                super__Vector_impl_data._M_start;
  r.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_140.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>
       ._M_impl.super__Vector_impl_data._M_start;
  r.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_140.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  r.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_140.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_140.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_140.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_140.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<mahjong::Pair,_std::allocator<mahjong::Pair>_>::~vector
            ((vector<mahjong::Pair,_std::allocator<mahjong::Pair>_> *)&local_158);
  local_158.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       r.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  local_158.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.
  super__Vector_impl_data._M_finish =
       r.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl
       .super__Vector_impl_data._M_finish;
  local_158.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.
  super__Vector_impl_data._M_start =
       r.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl
       .super__Vector_impl_data._M_start;
  r.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_140.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>
       ._M_impl.super__Vector_impl_data._M_start;
  r.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_140.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  r.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_140.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_140.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_140.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_140.wining_hand.melds.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>::~vector(&local_158);
  pTVar4 = r.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  pTVar3 = r.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
           _M_impl.super__Vector_impl_data._M_start;
  r.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_140.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>
       ._M_impl.super__Vector_impl_data._M_start;
  r.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_140.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  r.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_140.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_140.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_140.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_140.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pTVar3 != (pointer)0x0) {
    operator_delete(pTVar3,(long)pTVar4 - (long)pTVar3);
  }
  r.wining_hand.last_tile = local_140.wining_hand.last_tile;
  std::
  _Rb_tree<mahjong::Pattern,_mahjong::Pattern,_std::_Identity<mahjong::Pattern>,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
  ::clear(&this_02->_M_t);
  if (local_140.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var10 = &local_140.patterns._M_t._M_impl.super__Rb_tree_header;
    r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_140.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
    r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_140.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         local_140.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_140.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_140.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &p_Var1->_M_header;
    r.patterns._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_140.patterns._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_140.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_140.patterns._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_140.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var10->_M_header;
    local_140.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var10->_M_header;
  }
  r.bonus_tile_count = local_140.bonus_tile_count;
  r.doubling_factor = local_140.doubling_factor;
  std::
  _Rb_tree<mahjong::Pattern,_mahjong::Pattern,_std::_Identity<mahjong::Pattern>,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
  ::~_Rb_tree(&local_140.patterns._M_t);
  if (local_140.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_140.wining_hand.tiles.
                    super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_140.wining_hand.tiles.
                          super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.wining_hand.tiles.
                          super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>::~vector(&local_140.wining_hand.melds);
  std::vector<mahjong::Pair,_std::allocator<mahjong::Pair>_>::~vector
            ((vector<mahjong::Pair,_std::allocator<mahjong::Pair>_> *)&local_140);
  p_Var9 = &p_Var1->_M_header;
  for (p_Var11 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      (_Rb_tree_header *)p_Var11 != (_Rb_tree_header *)0x0;
      p_Var11 = (&p_Var11->_M_left)[(int)*(size_t *)(p_Var11 + 1) < 0xe]) {
    if (0xd < (int)*(size_t *)(p_Var11 + 1)) {
      p_Var9 = p_Var11;
    }
  }
  p_Var10 = p_Var1;
  if (((_Rb_tree_header *)p_Var9 != p_Var1) &&
     (p_Var10 = (_Rb_tree_header *)p_Var9, 0xe < (int)((_Rb_tree_header *)p_Var9)->_M_node_count)) {
    p_Var10 = p_Var1;
  }
  p_Var11 = &p_Var1->_M_header;
  p_Var9 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var10 == p_Var1) {
    for (; (_Rb_tree_header *)p_Var9 != (_Rb_tree_header *)0x0;
        p_Var9 = (&p_Var9->_M_left)[(int)*(size_t *)(p_Var9 + 1) < 0xe]) {
      if (0xd < (int)*(size_t *)(p_Var9 + 1)) {
        p_Var11 = p_Var9;
      }
    }
    p_Var9 = &p_Var1->_M_header;
    p_Var2 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var10 = p_Var1;
    if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
       (p_Var10 = (_Rb_tree_header *)p_Var11, 0xe < (int)((_Rb_tree_header *)p_Var11)->_M_node_count
       )) {
      p_Var10 = p_Var1;
    }
    for (; (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
        p_Var2 = (&p_Var2->_M_left)[(int)*(size_t *)(p_Var2 + 1) < 0xe]) {
      if (0xd < (int)*(size_t *)(p_Var2 + 1)) {
        p_Var9 = p_Var2;
      }
    }
    p_Var6 = p_Var1;
    if (((_Rb_tree_header *)p_Var9 != p_Var1) &&
       (p_Var6 = (_Rb_tree_header *)p_Var9, 0xe < (int)((_Rb_tree_header *)p_Var9)->_M_node_count))
    {
      p_Var6 = p_Var1;
    }
    if ((p_Var6 == p_Var1) == (p_Var10 != p_Var1)) {
      pUVar5 = UtestShell::getCurrent();
      (*pUVar5->_vptr_UtestShell[0x1b])
                (pUVar5,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                 ,0x1eb);
    }
    pUVar5 = UtestShell::getCurrent();
    StringFrom((int)&local_140);
    pcVar7 = SimpleString::asCharString((SimpleString *)&local_140);
    for (p_Var11 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var11 != (_Base_ptr)0x0; p_Var11 = (&p_Var11->_M_left)[(int)p_Var11[1]._M_color < 0xe]) {
    }
    StringFrom((unsigned_long)&local_158);
    pcVar8 = SimpleString::asCharString((SimpleString *)&local_158);
    local_160.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e08b8;
    (*pUVar5->_vptr_UtestShell[0x16])
              (pUVar5,1,pcVar7,pcVar8,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x1eb,&local_160);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_160);
    SimpleString::~SimpleString((SimpleString *)&local_158);
    SimpleString::~SimpleString((SimpleString *)&local_140);
  }
  else {
    pUVar5 = UtestShell::getCurrent();
    local_140.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_exitCurrentTest_001e08b8;
    (*pUVar5->_vptr_UtestShell[0xe])
              (pUVar5,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x1eb,&local_140);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_140);
  }
  if (r.doubling_factor == 1) {
    pUVar5 = UtestShell::getCurrent();
    local_140.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_exitCurrentTest_001e08b8;
    (*pUVar5->_vptr_UtestShell[0xe])
              (pUVar5,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x1ec,&local_140);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_140);
  }
  else {
    pUVar5 = UtestShell::getCurrent();
    StringFrom((int)&local_140);
    pcVar7 = SimpleString::asCharString((SimpleString *)&local_140);
    StringFrom((int)&local_158);
    pcVar8 = SimpleString::asCharString((SimpleString *)&local_158);
    local_160.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e08b8;
    (*pUVar5->_vptr_UtestShell[0x16])
              (pUVar5,1,pcVar7,pcVar8,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x1ec,&local_160);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_160);
    SimpleString::~SimpleString((SimpleString *)&local_158);
    SimpleString::~SimpleString((SimpleString *)&local_140);
  }
  std::
  _Rb_tree<mahjong::Pattern,_mahjong::Pattern,_std::_Identity<mahjong::Pattern>,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
  ::~_Rb_tree(&this_02->_M_t);
  if (r.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(r.wining_hand.tiles.
                    super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)r.wining_hand.tiles.
                          super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)r.wining_hand.tiles.
                          super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>::~vector(&r.wining_hand.melds);
  std::vector<mahjong::Pair,_std::allocator<mahjong::Pair>_>::~vector
            ((vector<mahjong::Pair,_std::allocator<mahjong::Pair>_> *)&r);
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, HonorTiles_Wind)
{
	s.setRoundWind(Tile::EastWind);
	s.setSeatWind(Tile::SouthWind);

	addPair(Tile::WhiteDragon);
	addSequence(Tile::OneOfCharacters, true);
	addSequence(Tile::TwoOfCircles, false);
	addSequence(Tile::TwoOfBamboos, false);
	addTriplet(Tile::EastWind, false);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::EastWind));
	CHECK_EQUAL(1, r.doubling_factor);

	s.setSeatWind(Tile::EastWind);	
	r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::DoubleEastWind));
	CHECK_EQUAL(2, r.doubling_factor);

	s.setRoundWind(Tile::SouthWind);
	r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::EastWind));
	CHECK_EQUAL(1, r.doubling_factor);
}